

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O1

Vec_Wec_t * Gia_Iso2ManDerivePoClasses(Gia_Man_t *pGia)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  Vec_Int_t *pVVar11;
  uint *__ptr;
  void *pvVar12;
  uint *__ptr_00;
  Vec_Wec_t *pVVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  uint *puVar20;
  uint *puVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  long local_40;
  
  iVar24 = pGia->vCos->nSize - pGia->nRegs;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  iVar14 = 0x10;
  if (0xe < iVar24 - 1U) {
    iVar14 = iVar24;
  }
  pVVar9->nSize = 0;
  pVVar9->nCap = iVar14;
  if (iVar14 == 0) {
    piVar10 = (int *)0x0;
  }
  else {
    piVar10 = (int *)malloc((long)iVar14 << 2);
  }
  pVVar9->pArray = piVar10;
  pVVar11 = pGia->vCos;
  uVar15 = (ulong)(uint)pVVar11->nSize;
  if (pGia->nRegs < pVVar11->nSize) {
    lVar25 = 0;
    do {
      if ((int)uVar15 <= lVar25) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar14 = pVVar11->pArray[lVar25];
      if (((long)iVar14 < 0) || (pGia->nObjs <= iVar14)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      Vec_IntPush(pVVar9,pGia->pObjs[iVar14].Value);
      lVar25 = lVar25 + 1;
      pVVar11 = pGia->vCos;
      uVar15 = (ulong)pVVar11->nSize;
    } while (lVar25 < (long)(uVar15 - (long)pGia->nRegs));
  }
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  pVVar11->nCap = 100;
  pVVar11->nSize = 0;
  piVar10 = (int *)malloc(400);
  pVVar11->pArray = piVar10;
  uVar1 = pVVar9->nSize;
  uVar17 = uVar1 - 1;
  while( true ) {
    do {
      uVar22 = uVar17;
      uVar17 = uVar22 + 1;
    } while ((uVar22 & 1) != 0);
    if (uVar17 < 9) break;
    iVar14 = 5;
    while (uVar17 % (iVar14 - 2U) != 0) {
      uVar7 = iVar14 * iVar14;
      iVar14 = iVar14 + 2;
      if (uVar17 < uVar7) goto LAB_0074c7f9;
    }
  }
LAB_0074c7f9:
  __ptr = (uint *)malloc(0x10);
  uVar7 = uVar17;
  if (uVar22 < 0xf) {
    uVar7 = 0x10;
  }
  __ptr[1] = 0;
  *__ptr = uVar7;
  pvVar12 = malloc((long)(int)uVar7 << 2);
  *(void **)(__ptr + 2) = pvVar12;
  __ptr[1] = uVar17;
  if (pvVar12 != (void *)0x0) {
    memset(pvVar12,0xff,(long)(int)uVar17 << 2);
  }
  __ptr_00 = (uint *)malloc(0x10);
  uVar17 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar17 = uVar1;
  }
  __ptr_00[1] = 0;
  *__ptr_00 = uVar17;
  if (uVar17 == 0) {
    pvVar12 = (void *)0x0;
  }
  else {
    pvVar12 = malloc((long)(int)uVar17 << 3);
  }
  *(void **)(__ptr_00 + 2) = pvVar12;
  if (0 < (int)uVar1) {
    local_40 = 0;
    uVar15 = 0;
    do {
      uVar17 = __ptr_00[1];
      if ((int)__ptr[1] < (int)uVar17) {
        uVar19 = (ulong)(__ptr[1] * 2 - 1);
        while( true ) {
          do {
            uVar22 = (uint)uVar19;
            uVar7 = uVar22 + 1;
            uVar18 = (ulong)uVar7;
            uVar4 = uVar19 & 1;
            uVar19 = uVar18;
          } while (uVar4 != 0);
          if (uVar7 < 9) break;
          iVar14 = 5;
          while (uVar7 % (iVar14 - 2U) != 0) {
            uVar8 = iVar14 * iVar14;
            iVar14 = iVar14 + 2;
            if (uVar7 < uVar8) goto LAB_0074c8fc;
          }
        }
LAB_0074c8fc:
        if ((int)*__ptr < (int)uVar7) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar12 = malloc((long)(int)uVar7 << 2);
          }
          else {
            pvVar12 = realloc(*(void **)(__ptr + 2),(long)(int)uVar7 << 2);
          }
          *(void **)(__ptr + 2) = pvVar12;
          if (pvVar12 == (void *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          *__ptr = uVar7;
        }
        if (uVar22 < 0x7fffffff) {
          memset(*(void **)(__ptr + 2),0xff,uVar18 << 2);
        }
        __ptr[1] = uVar7;
        if (0 < (int)uVar17) {
          lVar25 = *(long *)(__ptr_00 + 2);
          uVar19 = 0;
          do {
            iVar14 = *(int *)(lVar25 + uVar19 * 8);
            if (((long)iVar14 < 0) || ((int)uVar1 <= iVar14)) goto LAB_0074cd7e;
            lVar16 = 0;
            uVar22 = 0;
            do {
              lVar5 = lVar16 + (long)iVar14 * 4;
              lVar16 = lVar16 + 1;
              uVar22 = (*(byte *)((long)pVVar9->pArray + lVar5) + uVar22) * 0x401;
              uVar22 = uVar22 >> 6 ^ uVar22;
            } while (lVar16 != 4);
            uVar4 = (ulong)((uVar22 * 9 >> 0xb ^ uVar22 * 9) * 0x8001) % uVar18;
            if (((int)uVar4 < 0) || ((int)uVar7 <= (int)uVar4)) goto LAB_0074cd7e;
            lVar16 = *(long *)(__ptr + 2);
            *(undefined4 *)(lVar25 + 4 + uVar19 * 8) = *(undefined4 *)(lVar16 + uVar4 * 4);
            *(int *)(lVar16 + uVar4 * 4) = (int)uVar19;
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar17);
        }
      }
      if (uVar15 == uVar1) {
LAB_0074cd7e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar10 = pVVar9->pArray;
      lVar25 = 0;
      uVar22 = 0;
      do {
        lVar16 = lVar25 + local_40;
        lVar25 = lVar25 + 1;
        uVar22 = (*(byte *)((long)piVar10 + lVar16) + uVar22) * 0x401;
        uVar22 = uVar22 >> 6 ^ uVar22;
      } while (lVar25 != 4);
      uVar19 = (ulong)((uVar22 * 9 >> 0xb ^ uVar22 * 9) * 0x8001) % (ulong)__ptr[1];
      iVar14 = (int)uVar19;
      if ((iVar14 < 0) || ((int)__ptr[1] <= iVar14)) goto LAB_0074cd7e;
      puVar6 = (uint *)(uVar19 * 4 + *(long *)(__ptr + 2));
      do {
        puVar20 = puVar6;
        uVar22 = *puVar20;
        if ((ulong)uVar22 == 0xffffffff) {
          puVar21 = (uint *)0x0;
        }
        else {
          if (((int)uVar22 < 0) || ((int)uVar17 <= (int)uVar22)) goto LAB_0074cd9d;
          puVar21 = (uint *)((ulong)uVar22 * 8 + *(long *)(__ptr_00 + 2));
        }
        if (puVar21 == (uint *)0x0) {
          if (uVar22 != 0xffffffff) {
            __assert_fail("*pPlace == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecHsh.h"
                          ,0x138,"int *Hsh_IntManLookup(Hsh_IntMan_t *, unsigned int *)");
          }
          goto LAB_0074cade;
        }
        if (uVar1 <= *puVar21) goto LAB_0074cd7e;
        puVar6 = puVar21 + 1;
      } while (piVar10[uVar15] != piVar10[*puVar21]);
      if (uVar22 == 0xffffffff) {
LAB_0074cade:
        *puVar20 = uVar17;
        uVar22 = *__ptr_00;
        if (uVar17 == uVar22) {
          if ((int)uVar22 < 0x10) {
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar12 = malloc(0x80);
            }
            else {
              pvVar12 = realloc(*(void **)(__ptr_00 + 2),0x80);
            }
            *(void **)(__ptr_00 + 2) = pvVar12;
            uVar7 = 0x10;
          }
          else {
            uVar7 = uVar22 * 2;
            if ((int)uVar7 <= (int)uVar22) goto LAB_0074cb5a;
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar12 = malloc((ulong)uVar22 << 4);
            }
            else {
              pvVar12 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar22 << 4);
            }
            *(void **)(__ptr_00 + 2) = pvVar12;
          }
          if (pvVar12 == (void *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
          }
          *__ptr_00 = uVar7;
        }
LAB_0074cb5a:
        __ptr_00[1] = uVar17 + 1;
        *(ulong *)(*(long *)(__ptr_00 + 2) + (long)(int)uVar17 * 8) = uVar15 | 0xffffffff00000000;
      }
      else if (((int)uVar22 < 0) || (bVar3 = (int)uVar17 <= (int)uVar22, uVar17 = uVar22, bVar3)) {
LAB_0074cd9d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      Vec_IntPush(pVVar11,uVar17);
      uVar15 = uVar15 + 1;
      local_40 = local_40 + 4;
    } while (uVar15 != uVar1);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_00 + 2));
    __ptr_00[2] = 0;
    __ptr_00[3] = 0;
  }
  free(__ptr_00);
  if (pVVar9->pArray != (int *)0x0) {
    free(pVVar9->pArray);
    pVVar9->pArray = (int *)0x0;
  }
  free(pVVar9);
  uVar1 = pVVar11->nSize;
  uVar15 = (ulong)uVar1;
  if (uVar15 == 0) {
    uVar17 = 0;
  }
  else {
    uVar17 = *pVVar11->pArray;
    if (1 < (int)uVar1) {
      uVar19 = 1;
      do {
        uVar22 = pVVar11->pArray[uVar19];
        if ((int)uVar17 <= (int)uVar22) {
          uVar17 = uVar22;
        }
        uVar19 = uVar19 + 1;
      } while (uVar15 != uVar19);
    }
  }
  iVar14 = uVar17 + 1;
  pVVar13 = (Vec_Wec_t *)malloc(0x10);
  iVar24 = 8;
  if (6 < uVar17) {
    iVar24 = iVar14;
  }
  pVVar13->nSize = 0;
  pVVar13->nCap = iVar24;
  if (iVar24 == 0) {
    pVVar9 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar9 = (Vec_Int_t *)calloc((long)iVar24,0x10);
  }
  pVVar13->pArray = pVVar9;
  pVVar13->nSize = iVar14;
  if (0 < (int)uVar1) {
    piVar10 = pVVar11->pArray;
    uVar19 = 0;
    do {
      uVar1 = piVar10[uVar19];
      if (iVar14 <= (int)uVar1) {
        iVar23 = uVar1 + 1;
        iVar24 = iVar14 * 2;
        if (iVar14 * 2 <= iVar23) {
          iVar24 = iVar23;
        }
        iVar2 = pVVar13->nCap;
        iVar14 = iVar23;
        if (iVar2 < iVar24) {
          if (pVVar13->pArray == (Vec_Int_t *)0x0) {
            pVVar9 = (Vec_Int_t *)malloc((long)iVar24 << 4);
          }
          else {
            pVVar9 = (Vec_Int_t *)realloc(pVVar13->pArray,(long)iVar24 << 4);
          }
          pVVar13->pArray = pVVar9;
          memset(pVVar9 + iVar2,0,(long)(iVar24 - iVar2) << 4);
          pVVar13->nCap = iVar24;
        }
      }
      if (((int)uVar1 < 0) || (iVar14 <= (int)uVar1)) {
        pVVar13->nSize = iVar14;
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      Vec_IntPush(pVVar13->pArray + uVar1,(int)uVar19);
      uVar19 = uVar19 + 1;
    } while (uVar15 != uVar19);
    pVVar13->nSize = iVar14;
  }
  if (pVVar11->pArray != (int *)0x0) {
    free(pVVar11->pArray);
    pVVar11->pArray = (int *)0x0;
  }
  free(pVVar11);
  return pVVar13;
}

Assistant:

Vec_Wec_t * Gia_Iso2ManDerivePoClasses( Gia_Man_t * pGia )
{
    Vec_Wec_t * vEquivs;
    Vec_Int_t * vValues;
    Vec_Int_t * vMap;
    Gia_Obj_t * pObj;
    int i;
    vValues = Vec_IntAlloc( Gia_ManPoNum(pGia) );
    Gia_ManForEachPo( pGia, pObj, i )
        Vec_IntPush( vValues, pObj->Value );
    vMap = Hsh_IntManHashArray( vValues, 1 );
    Vec_IntFree( vValues );
    vEquivs = Vec_WecCreateClasses( vMap );
    Vec_IntFree( vMap );
    return vEquivs;    
}